

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall wabt::interp::Thread::DoSimdShift<int,int>(Thread *this,BinopFunc<int,_int> *f)

{
  int iVar1;
  u8 i;
  long lVar2;
  Value VVar3;
  SR result;
  Simd<int,_(unsigned_char)__x04_> lhs;
  anon_union_16_6_113bff37_for_Value_0 local_40;
  anon_union_16_6_113bff37_for_Value_0 local_30;
  
  VVar3 = Pop(this);
  local_30.v128_.v = (v128)Pop(this);
  lVar2 = 0;
  do {
    iVar1 = (*f)(*(int *)((long)&local_30 + lVar2 * 4),VVar3.field_0.i32_);
    *(int *)((long)&local_40 + lVar2 * 4) = iVar1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  Push(this,(Value)local_40.v128_.v);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdShift(BinopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  static_assert(ST::lanes == SR::lanes, "SIMD lanes don't match");
  auto amount = Pop<u32>();
  auto lhs = Pop<ST>();
  SR result;
  for (u8 i = 0; i < SR::lanes; ++i) {
    result[i] = f(lhs[i], amount);
  }
  Push(result);
  return RunResult::Ok;
}